

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O0

size_t json_dumpb(json_t *json,char *buffer,size_t size,size_t flags)

{
  int iVar1;
  size_t local_48;
  buffer buf;
  size_t flags_local;
  size_t size_local;
  char *buffer_local;
  json_t *json_local;
  
  buf.size = 0;
  local_48 = size;
  buf.used = (size_t)buffer;
  buf.data = (char *)flags;
  iVar1 = json_dump_callback(json,dump_to_buffer,&local_48,flags);
  if (iVar1 == 0) {
    json_local = (json_t *)buf.size;
  }
  else {
    json_local = (json_t *)0x0;
  }
  return (size_t)json_local;
}

Assistant:

size_t json_dumpb(const json_t *json, char *buffer, size_t size, size_t flags)
{
	struct buffer buf = { size, 0, buffer };

	if (json_dump_callback(json, dump_to_buffer, (void *)&buf, flags))
		return 0;

	return buf.used;
}